

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void pugi::impl::anon_unknown_0::as_utf8_end(char *buffer,size_t size,wchar_t *str,size_t length)

{
  uint ch;
  uint8_t *begin;
  wchar_t *pwVar1;
  
  if (str != (wchar_t *)0x0) {
    pwVar1 = (wchar_t *)0x0;
    do {
      ch = *(uint *)(size + (long)pwVar1 * 4);
      if (ch < 0x10000) {
        buffer = (char *)utf8_writer::low((value_type)buffer,ch);
      }
      else {
        *buffer = (byte)(ch >> 0x12) | 0xf0;
        ((byte *)buffer)[1] = (byte)(ch >> 0xc) & 0x3f | 0x80;
        ((byte *)buffer)[2] = (byte)(ch >> 6) & 0x3f | 0x80;
        ((byte *)buffer)[3] = (byte)ch & 0x3f | 0x80;
        buffer = (char *)((byte *)buffer + 4);
      }
      pwVar1 = (wchar_t *)((long)pwVar1 + 1);
    } while (str != pwVar1);
  }
  return;
}

Assistant:

static inline typename Traits::value_type process(const uint32_t* data, size_t size, typename Traits::value_type result, Traits)
		{
			while (size)
			{
				uint32_t lead = opt_swap::value ? endian_swap(*data) : *data;

				// U+0000..U+FFFF
				if (lead < 0x10000)
				{
					result = Traits::low(result, lead);
					data += 1;
					size -= 1;
				}
				// U+10000..U+10FFFF
				else
				{
					result = Traits::high(result, lead);
					data += 1;
					size -= 1;
				}
			}

			return result;
		}